

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void destroy_free<warm_cb>(void *temp)

{
  void *in_RDI;
  
  warm_cb::~warm_cb((warm_cb *)temp);
  free(in_RDI);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}